

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

UBool __thiscall
icu_63::RuleBasedBreakIterator::isBoundary(RuleBasedBreakIterator *this,int32_t offset)

{
  UBool UVar1;
  UErrorCode UVar2;
  UChar32 UVar3;
  int64_t iVar4;
  UErrorCode local_28;
  byte local_21;
  UErrorCode status;
  UErrorCode UStack_1c;
  bool result;
  int32_t adjustedOffset;
  int32_t offset_local;
  RuleBasedBreakIterator *this_local;
  
  UStack_1c = offset;
  _adjustedOffset = this;
  if (offset < 0) {
    (*(this->super_BreakIterator).super_UObject._vptr_UObject[10])();
    return '\0';
  }
  utext_setNativeIndex_63(&this->fText,(long)offset);
  iVar4 = utext_getNativeIndex_63(&this->fText);
  status = (UErrorCode)iVar4;
  local_21 = 0;
  local_28 = U_ZERO_ERROR;
  UVar1 = BreakCache::seek(this->fBreakCache,status);
  if ((UVar1 != '\0') ||
     (UVar1 = BreakCache::populateNear(this->fBreakCache,status,&local_28), UVar1 != '\0')) {
    UVar2 = BreakCache::current(this->fBreakCache);
    local_21 = UVar2 == UStack_1c;
  }
  if ((((local_21 & 1) != 0) && (status < UStack_1c)) &&
     (UVar3 = utext_char32At_63(&this->fText,(long)UStack_1c), UVar3 == -1)) {
    return '\0';
  }
  if ((local_21 & 1) == 0) {
    (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xd])();
  }
  return local_21 & 1;
}

Assistant:

UBool RuleBasedBreakIterator::isBoundary(int32_t offset) {
    // out-of-range indexes are never boundary positions
    if (offset < 0) {
        first();       // For side effects on current position, tag values.
        return FALSE;
    }

    // Adjust offset to be on a code point boundary and not beyond the end of the text.
    // Note that isBoundary() is always false for offsets that are not on code point boundaries.
    // But we still need the side effect of leaving iteration at the following boundary.

    utext_setNativeIndex(&fText, offset);
    int32_t adjustedOffset = static_cast<int32_t>(utext_getNativeIndex(&fText));

    bool result = false;
    UErrorCode status = U_ZERO_ERROR;
    if (fBreakCache->seek(adjustedOffset) || fBreakCache->populateNear(adjustedOffset, status)) {
        result = (fBreakCache->current() == offset);
    }

    if (result && adjustedOffset < offset && utext_char32At(&fText, offset) == U_SENTINEL) {
        // Original offset is beyond the end of the text. Return FALSE, it's not a boundary,
        // but the iteration position remains set to the end of the text, which is a boundary.
        return FALSE;
    }
    if (!result) {
        // Not on a boundary. isBoundary() must leave iterator on the following boundary.
        // Cache->seek(), above, left us on the preceding boundary, so advance one.
        next();
    }
    return result;
}